

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O3

void soplex::powRound(Rational *r)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  type_conflict1 tVar4;
  Rational *__src;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *__src_00;
  undefined8 uVar5;
  Integer base;
  Integer num;
  Integer den;
  Integer roundval;
  data_type local_a8;
  uint local_98;
  undefined2 local_94;
  char local_92;
  ulong local_88;
  limb_pointer puStack_80;
  uint local_78;
  undefined2 local_74;
  char local_72;
  unsigned_long_long local_68;
  limb_pointer puStack_60;
  uint local_58;
  undefined2 local_54;
  char local_52;
  data_type local_48;
  int local_38;
  undefined2 local_34;
  char local_32;
  uint local_24;
  
  local_48.la[0] = 0;
  local_38 = 1;
  local_34 = 0x100;
  local_32 = '\0';
  local_68 = 0;
  local_58 = 1;
  local_54 = 0x100;
  local_52 = '\0';
  local_88 = 0;
  local_78 = 1;
  local_74 = 0x100;
  local_72 = '\0';
  local_a8.la[0] = 0;
  local_92 = (r->m_backend).m_value.num.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_alias;
  uVar1 = (r->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_98 = 0;
  if ((bool)local_92 != false) {
    local_98 = uVar1;
  }
  local_94 = CONCAT11(local_92,(r->m_backend).m_value.num.m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_sign) ^ 0x100;
  if ((bool)local_92 == true) {
    local_a8.la[0] =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_a8.ld.data =
         (r->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_a8.ld,uVar1,uVar1);
    uVar5 = &local_a8;
    if (local_94._1_1_ == '\0') {
      uVar5 = local_a8.ld.data;
    }
    __src = r;
    if ((r->m_backend).m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      __src = (Rational *)
              (r->m_backend).m_value.num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.data;
    }
    memcpy((void *)uVar5,__src,
           (ulong)(r->m_backend).m_value.num.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
    if (((local_74 & 0x100) == 0) && (local_72 == '\0')) {
      operator_delete(puStack_80,(local_88 & 0xffffffff) << 3);
    }
  }
  cVar3 = local_92;
  local_78 = local_98;
  cVar2 = local_94._1_1_;
  local_74 = local_94;
  local_72 = local_92;
  if (local_94._1_1_ == '\0') {
    local_88 = local_a8.la[0];
    puStack_80 = local_a8.ld.data;
  }
  else {
    memcpy(&local_88,&local_a8,(ulong)local_98 << 3);
    if ((cVar2 == '\0') && (cVar3 == '\0')) {
      operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
    }
  }
  __src_00 = &(r->m_backend).m_value.den;
  local_a8.la[0] = 0;
  local_92 = (r->m_backend).m_value.den.m_backend.
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_alias;
  uVar1 = (r->m_backend).m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_98 = 0;
  if ((bool)local_92 != false) {
    local_98 = uVar1;
  }
  local_94 = CONCAT11(local_92,(r->m_backend).m_value.den.m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_sign) ^ 0x100;
  if ((bool)local_92 == true) {
    local_a8.la[0] =
         (__src_00->m_backend).
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_a8.ld.data =
         (r->m_backend).m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_a8.ld,uVar1,uVar1);
    uVar5 = &local_a8;
    if (local_94._1_1_ == '\0') {
      uVar5 = local_a8.ld.data;
    }
    if ((r->m_backend).m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      __src_00 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)(r->m_backend).m_value.den.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.ld.data;
    }
    memcpy((void *)uVar5,__src_00,
           (ulong)(r->m_backend).m_value.den.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  if ((local_54._1_1_ == '\0') && (local_52 == '\0')) {
    operator_delete(puStack_60,(local_68 & 0xffffffff) << 3);
  }
  cVar3 = local_92;
  local_58 = local_98;
  cVar2 = local_94._1_1_;
  local_54 = local_94;
  local_52 = local_92;
  if (local_94._1_1_ == '\0') {
    local_68 = local_a8.la[0];
    puStack_60 = local_a8.ld.data;
  }
  else {
    memcpy(&local_68,&local_a8,(ulong)local_98 << 3);
    if ((cVar2 == '\0') && (cVar3 == '\0')) {
      operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
    }
  }
  local_a8.la[0] = (limb_type)&local_88;
  local_a8.ld.data = &local_68;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
  ::
  do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>>
            ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
              *)&local_48.ld,
             (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)&local_a8.ld,(divide_immediates *)&local_24);
  if (((char)local_34 == '\0') && (local_38 == 1)) {
    uVar5 = &local_48;
    if (local_34._1_1_ == '\0') {
      uVar5 = local_48.ld.data;
    }
    if (*(limb_type *)uVar5 == 0) {
      local_24 = 1;
      goto LAB_0034fa23;
    }
  }
  tVar4 = boost::multiprecision::backends::
          eval_msb<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&local_48.ld);
  local_24 = tVar4 + 1;
LAB_0034fa23:
  local_a8.la[0] = 2;
  local_98 = 1;
  local_94 = 0x100;
  local_92 = '\0';
  boost::multiprecision::default_ops::detail::
  pow_imp<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,unsigned_int>
            ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_48.ld,
             (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_a8.ld,&local_24,
             (false_ *)_ZZNK5boost17integral_constantIbLb0EEcvRKN4mpl_5bool_ILb0EEEEvE5pdata);
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
  ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
               *)r,(cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_48.ld);
  if ((local_94._1_1_ == '\0') && (local_92 == '\0')) {
    operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
  }
  if ((local_74._1_1_ == '\0') && (local_72 == '\0')) {
    operator_delete(puStack_80,(local_88 & 0xffffffff) << 3);
  }
  if ((local_54._1_1_ == '\0') && (local_52 == '\0')) {
    operator_delete(puStack_60,(local_68 & 0xffffffff) << 3);
  }
  if ((local_34._1_1_ == '\0') && (local_32 == '\0')) {
    operator_delete(local_48.ld.data,(local_48.la[0] & 0xffffffff) << 3);
  }
  return;
}

Assistant:

inline void powRound(Rational& r)
{
   Integer roundval;
   Integer den;
   Integer num;

   num = numerator(r);
   den = denominator(r);
   roundval = num / den;

   size_t binlog = roundval == 0 ? 1 : msb(roundval) + 1;
   Integer base = 2;

   roundval = boost::multiprecision::pow(base, (unsigned int)binlog);

   r = roundval;
}